

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O1

int zddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  MtrHalfWord MVar1;
  MtrHalfWord MVar2;
  DdSubtable *pDVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  MtrNode *pMVar11;
  ulong uVar12;
  uint *puVar13;
  DdHalfWord upper;
  DdHalfWord DVar14;
  uint uVar15;
  long lVar16;
  DdNode *pDVar17;
  uint uVar18;
  void *__ptr;
  int *piVar19;
  uint lower;
  bool bVar20;
  DdNode *local_78;
  uint local_6c;
  void *local_68;
  void *local_60;
  int *local_58;
  long local_50;
  long local_48;
  int local_40;
  int local_3c;
  long local_38;
  
  uVar18 = table->sizeZ;
  upper = 0xffffffff;
  lower = uVar18;
  if ((int)treenode->low < (int)uVar18) {
    lower = table->permZ[treenode->index];
    upper = (treenode->size + lower) - 1;
    if ((int)uVar18 <= (int)upper) {
      pMVar11 = treenode->child;
      if (pMVar11 == (MtrNode *)0x0) {
        upper = uVar18 - 1;
      }
      else {
        DVar14 = 0xffffffff;
        do {
          iVar5 = table->permZ[pMVar11->low];
          upper = iVar5 - 1;
          if ((int)(pMVar11->size + upper) < (int)uVar18) {
            upper = DVar14;
          }
          if ((int)uVar18 <= iVar5) {
            upper = DVar14;
          }
          pMVar11 = pMVar11->younger;
          DVar14 = upper;
        } while (pMVar11 != (MtrNode *)0x0);
      }
    }
  }
  if (upper == 0xffffffff) {
    return 1;
  }
  iVar5 = 1;
  if (treenode->flags != 4) {
    iVar6 = 0;
    switch(method) {
    case CUDD_REORDER_RANDOM:
    case CUDD_REORDER_RANDOM_PIVOT:
      iVar5 = cuddZddSwapping(table,lower,upper,method);
      break;
    case CUDD_REORDER_SIFT:
      iVar5 = cuddZddSifting(table,lower,upper);
      break;
    case CUDD_REORDER_SIFT_CONVERGE:
      do {
        uVar18 = table->keysZ;
        iVar5 = cuddZddSifting(table,lower,upper);
        if (uVar18 <= table->keysZ) break;
      } while (iVar5 != 0);
      break;
    case CUDD_REORDER_SYMM_SIFT:
      iVar5 = cuddZddSymmSifting(table,lower,upper);
      break;
    case CUDD_REORDER_SYMM_SIFT_CONV:
      iVar5 = cuddZddSymmSiftingConv(table,lower,upper);
      break;
    default:
      goto switchD_007a0d0f_caseD_8;
    case CUDD_REORDER_GROUP_SIFT:
      entry = (int *)0x0;
      local_60 = (void *)((long)(int)uVar18 << 2);
      local_68 = malloc((size_t)local_60);
      if (local_68 == (void *)0x0) {
        table->errorCode = CUDD_MEMORY_OUT;
        pvVar7 = (void *)0x0;
      }
      else {
        entry = (int *)malloc((size_t)local_60);
        if ((entry != (int *)0x0) &&
           (local_58 = entry, pvVar7 = malloc((size_t)local_60), pvVar7 != (void *)0x0)) {
          if ((int)uVar18 < 1) {
            piVar19 = (int *)0x0;
          }
          else {
            pDVar3 = table->subtableZ;
            piVar4 = table->permZ;
            uVar12 = 0;
            piVar19 = (int *)0x0;
            do {
              *(undefined4 *)((long)pvVar7 + uVar12 * 4) = 0;
              uVar15 = piVar4[uVar12];
              if (pDVar3[(int)uVar15].next <= uVar15) {
                local_58[uVar12] = pDVar3[(int)uVar15].keys;
                *(int *)((long)local_68 + (long)(int)piVar19 * 4) = (int)uVar12;
                piVar19 = (int *)(ulong)((int)piVar19 + 1);
              }
              uVar12 = uVar12 + 1;
            } while (uVar18 != uVar12);
          }
          local_60 = pvVar7;
          local_58 = piVar19;
          qsort(local_68,(long)(int)piVar19,4,zddUniqueCompareGroup);
          iVar6 = table->siftMaxVar;
          if ((int)piVar19 < iVar6) {
            iVar6 = (int)local_58;
          }
          pvVar7 = local_60;
          __ptr = local_68;
          if (0 < iVar6) {
            lVar8 = 0;
            piVar19 = local_58;
            do {
              if (table->siftMaxSwap <= zddTotalNumberSwapping) break;
              lVar16 = (long)*(int *)((long)__ptr + lVar8 * 4);
              if (((*(int *)((long)pvVar7 + lVar16 * 4) != 1) &&
                  (DVar14 = table->permZ[lVar16], (int)lower <= (int)DVar14)) &&
                 ((int)DVar14 <= (int)upper)) {
                local_78 = (DdNode *)0x0;
                if (DVar14 - lower != 0) {
                  local_38 = (long)(int)DVar14;
                  local_6c = table->keysZ;
                  local_50 = lVar16;
                  local_48 = lVar8;
                  local_40 = DVar14 - lower;
                  local_3c = upper - DVar14;
                  iVar6 = cuddZddNextHigh(table,DVar14);
                  if ((int)upper < iVar6) {
                    uVar18 = table->subtableZ[local_38].next;
LAB_007a10e3:
                    iVar6 = zddGroupSiftingUp(table,uVar18,lower,(Move **)&local_78);
                    goto LAB_007a114d;
                  }
                  if (local_3c < local_40) {
                    iVar6 = zddGroupSiftingDown(table,DVar14,upper,(Move **)&local_78);
                    if (iVar6 != 0) {
                      if (local_78 != (DdNode *)0x0) {
                        DVar14 = local_78->ref;
                      }
                      do {
                        uVar18 = table->subtableZ[(int)DVar14].next;
                        bVar20 = DVar14 < uVar18;
                        DVar14 = uVar18;
                      } while (bVar20);
                      goto LAB_007a10e3;
                    }
                  }
                  else {
                    uVar18 = table->subtableZ[local_38].next;
                    iVar6 = zddGroupSiftingUp(table,uVar18,lower,(Move **)&local_78);
                    if (iVar6 != 0) {
                      if (local_78 != (DdNode *)0x0) {
                        uVar18 = local_78->index;
                      }
                      do {
                        DVar14 = uVar18;
                        uVar18 = table->subtableZ[(int)DVar14].next;
                        uVar15 = local_6c;
                        lVar16 = local_50;
                        lVar8 = local_48;
                      } while (DVar14 < uVar18);
                      goto LAB_007a1143;
                    }
                  }
LAB_007a1254:
                  pvVar7 = local_60;
                  if (local_78 != (DdNode *)0x0) {
                    pDVar10 = table->nextFree;
                    pDVar9 = local_78;
                    do {
                      pDVar17 = pDVar9;
                      pDVar9 = (pDVar17->type).kids.T;
                      pDVar17->ref = 0;
                      pDVar17->next = pDVar10;
                      pDVar10 = pDVar17;
                    } while (pDVar9 != (DdNode *)0x0);
                    table->nextFree = pDVar17;
                  }
                  goto LAB_007a0f22;
                }
                uVar15 = table->keysZ;
                if (upper != DVar14) {
LAB_007a1143:
                  local_48 = lVar8;
                  local_50 = lVar16;
                  local_6c = uVar15;
                  iVar6 = zddGroupSiftingDown(table,DVar14,upper,(Move **)&local_78);
LAB_007a114d:
                  if ((iVar6 == 0) ||
                     (iVar6 = zddGroupSiftingBackward(table,(Move *)local_78,local_6c), iVar6 == 0))
                  goto LAB_007a1254;
                  lVar16 = local_50;
                  pvVar7 = local_60;
                  __ptr = local_68;
                  piVar19 = local_58;
                  lVar8 = local_48;
                  if (local_78 != (DdNode *)0x0) {
                    pDVar9 = table->nextFree;
                    do {
                      pDVar10 = local_78;
                      local_78 = (pDVar10->type).kids.T;
                      pDVar10->ref = 0;
                      pDVar10->next = pDVar9;
                      pDVar9 = pDVar10;
                    } while (local_78 != (DdNode *)0x0);
                    table->nextFree = pDVar10;
                  }
                }
                local_78 = (DdNode *)0x0;
                pDVar3 = table->subtableZ;
                uVar18 = table->permZ[lVar16];
                if (uVar18 != pDVar3[(int)uVar18].next) {
                  piVar4 = table->invpermZ;
                  uVar15 = uVar18;
                  do {
                    *(undefined4 *)((long)pvVar7 + (long)piVar4[(int)uVar15] * 4) = 1;
                    uVar15 = pDVar3[(int)uVar15].next;
                  } while (uVar15 != uVar18);
                }
              }
              lVar8 = lVar8 + 1;
              iVar6 = table->siftMaxVar;
              if ((int)piVar19 < table->siftMaxVar) {
                iVar6 = (int)piVar19;
              }
            } while (lVar8 < iVar6);
          }
          free(pvVar7);
          free(__ptr);
          if (entry != (int *)0x0) {
            free(entry);
            entry = (int *)0x0;
          }
          break;
        }
        table->errorCode = CUDD_MEMORY_OUT;
        pvVar7 = (void *)0x0;
      }
LAB_007a0f22:
      if (entry != (int *)0x0) {
        free(entry);
        entry = (int *)0x0;
      }
      if (local_68 != (void *)0x0) {
        free(local_68);
      }
      iVar5 = 0;
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
      }
      break;
    case CUDD_REORDER_LINEAR:
      iVar5 = cuddZddLinearSifting(table,lower,upper);
      break;
    case CUDD_REORDER_LINEAR_CONVERGE:
      do {
        uVar18 = table->keysZ;
        iVar5 = cuddZddLinearSifting(table,lower,upper);
        if (uVar18 <= table->keysZ) break;
      } while (iVar5 != 0);
    }
  }
  lVar8 = (long)(int)lower;
  if (table->treeZ != treenode) {
    if ((int)lower < (int)upper) {
      puVar13 = &table->subtableZ[lVar8].next;
      lVar16 = (int)upper - lVar8;
      uVar18 = lower;
      do {
        uVar18 = uVar18 + 1;
        *puVar13 = uVar18;
        puVar13 = puVar13 + 0xe;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    table->subtableZ[(int)upper].next = lower;
  }
  MVar1 = treenode->index;
  MVar2 = table->invpermZ[lVar8];
  do {
    treenode->index = MVar2;
    treenode = treenode->parent;
    if (treenode == (MtrNode *)0x0) {
      return iVar5;
    }
    iVar6 = iVar5;
  } while (treenode->index == MVar1);
switchD_007a0d0f_caseD_8:
  return iVar6;
}

Assistant:

static int
zddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    zddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddZddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddZddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddZddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddZddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            result = zddGroupSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddZddLinearSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keysZ;
                result = cuddZddLinearSifting(table,lower,upper);
                if (initialSize <= table->keysZ)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of zddGroupSifting.
    */
    zddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"zddReorderChildren:");
#endif

    return(result);

}